

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O0

int Gia_ManSeqMarkUsed(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  bool bVar3;
  undefined4 local_28;
  undefined4 local_24;
  int nNodes;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRoots;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  Gia_ManSetMark0(p);
  pGVar2 = Gia_ManConst0(p);
  *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff;
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar3 = false;
    if (local_24 < iVar1) {
      _nNodes = Gia_ManCi(p,local_24);
      bVar3 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)_nNodes = *(ulong *)_nNodes & 0xffffffffbfffffff;
    local_24 = local_24 + 1;
  }
  p_00 = Gia_ManCollectPoIds(p);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00);
    bVar3 = false;
    if (local_24 < iVar1) {
      iVar1 = Vec_IntEntry(p_00,local_24);
      _nNodes = Gia_ManObj(p,iVar1);
      bVar3 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ManSeqMarkUsed_rec(p,_nNodes,p_00);
    local_28 = iVar1 + local_28;
    local_24 = local_24 + 1;
  }
  Vec_IntFree(p_00);
  return local_28;
}

Assistant:

int Gia_ManSeqMarkUsed( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Gia_ManSetMark0( p );
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark0 = 0;
    vRoots = Gia_ManCollectPoIds( p );
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
        nNodes += Gia_ManSeqMarkUsed_rec( p, pObj, vRoots );
    Vec_IntFree( vRoots );
    return nNodes;
}